

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_key.cpp
# Opt level: O0

Privkey * __thiscall
cfd::api::KeyApi::GetPrivkeyFromWif(KeyApi *this,string *wif,NetType *net_type,bool *is_compressed)

{
  undefined1 uVar1;
  bool bVar2;
  undefined8 uVar3;
  NetType *in_RCX;
  string *in_RDX;
  string *in_RDI;
  byte *in_R8;
  bool has_wif;
  NetType temp_net_type;
  bool is_compress;
  Privkey *key;
  Privkey *in_stack_ffffffffffffff48;
  Privkey *in_stack_ffffffffffffff50;
  allocator *paVar4;
  string *psVar5;
  CfdError error_code;
  undefined5 in_stack_ffffffffffffff70;
  undefined1 uVar6;
  allocator in_stack_ffffffffffffff77;
  string local_88 [32];
  Privkey local_68;
  undefined1 local_31;
  NetType local_30;
  bool local_2a [2];
  byte *local_28;
  NetType *local_20;
  string *local_18;
  
  local_2a[1] = false;
  psVar5 = in_RDI;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  core::Privkey::Privkey((Privkey *)in_RDI);
  local_2a[0] = true;
  local_30 = kMainnet;
  uVar1 = core::Privkey::HasWif(local_18,&local_30,local_2a);
  local_31 = uVar1;
  if ((bool)uVar1) {
    core::Privkey::FromWif(&local_68,local_18,local_30,(bool)(local_2a[0] & 1));
    core::Privkey::operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    core::Privkey::~Privkey((Privkey *)0x63f1d9);
    if (local_20 != (NetType *)0x0) {
      *local_20 = local_30;
    }
    if (local_28 != (byte *)0x0) {
      *local_28 = local_2a[0] & 1;
    }
  }
  bVar2 = core::Privkey::IsValid((Privkey *)in_RDI);
  if (!bVar2) {
    uVar6 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    error_code = (CfdError)((ulong)psVar5 >> 0x20);
    paVar4 = (allocator *)&stack0xffffffffffffff77;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"Failed to GetPrivkeyFromWif. Wif format error.",paVar4);
    core::CfdException::CfdException
              ((CfdException *)
               CONCAT17(in_stack_ffffffffffffff77,
                        CONCAT16(uVar6,CONCAT15(uVar1,in_stack_ffffffffffffff70))),error_code,in_RDI
              );
    __cxa_throw(uVar3,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  return (Privkey *)psVar5;
}

Assistant:

Privkey KeyApi::GetPrivkeyFromWif(
    const std::string& wif, NetType* net_type, bool* is_compressed) const {
  Privkey key;
  bool is_compress = true;
  NetType temp_net_type = NetType::kMainnet;

  bool has_wif = Privkey::HasWif(wif, &temp_net_type, &is_compress);
  if (has_wif) {
    key = Privkey::FromWif(wif, temp_net_type, is_compress);
    if (net_type != nullptr) *net_type = temp_net_type;
    if (is_compressed != nullptr) *is_compressed = is_compress;
  }

  if (!key.IsValid()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to GetPrivkeyFromWif. Wif format error.");
  }
  return key;
}